

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfdapi_transaction.cpp
# Opt level: O0

void __thiscall
TransactionApi_FundRawTransaction_MillionAmountValue_Test::TestBody
          (TransactionApi_FundRawTransaction_MillionAmountValue_Test *this)

{
  initializer_list<cfd::UtxoData> __l;
  bool bVar1;
  uint32_t uVar2;
  char *pcVar3;
  Amount AVar4;
  AssertionResult gtest_ar_4;
  uint32_t minimum_fee;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  CfdException *anon_var_0_1;
  bool gtest_caught_expected_1;
  ConstCharPtr gtest_msg_1;
  CfdException *anon_var_0;
  bool gtest_caught_expected;
  ConstCharPtr gtest_msg;
  ByteData tx;
  AssertionResult gtest_ar;
  TransactionController tx_obj;
  TransactionApi api;
  Amount estimate_fee;
  Amount target_value;
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> selected_txin_utxos;
  CoinSelectionOption option;
  double effective_fee_rate;
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> utxos;
  TransactionContext txc;
  Amount fee;
  Address address3;
  Address address2;
  Address address;
  UtxoData utxo3;
  UtxoData utxo2;
  UtxoData utxo1;
  AddressFactory factory;
  undefined8 in_stack_ffffffffffffcc18;
  string *tx_hex;
  UtxoData *in_stack_ffffffffffffcc20;
  UtxoData *this_00;
  AddressFactory *in_stack_ffffffffffffcc28;
  TransactionContext *this_01;
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *this_02;
  char *pcVar5;
  allocator_type *in_stack_ffffffffffffcc48;
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *in_stack_ffffffffffffcc50;
  TransactionContext *in_stack_ffffffffffffcc58;
  undefined4 in_stack_ffffffffffffcc60;
  undefined4 in_stack_ffffffffffffcc64;
  undefined7 in_stack_ffffffffffffcc80;
  undefined1 in_stack_ffffffffffffcc87;
  UtxoData *in_stack_ffffffffffffcc88;
  undefined7 in_stack_ffffffffffffcc90;
  undefined1 in_stack_ffffffffffffcc97;
  Address *in_stack_ffffffffffffcc98;
  TransactionContext *in_stack_ffffffffffffcca0;
  ScriptElement *local_32a0;
  AssertHelper local_3210;
  Message local_3208;
  undefined4 local_31fc;
  AssertionResult local_31f8;
  int local_31e4;
  AssertHelper local_31e0;
  Message local_31d8;
  undefined4 local_31d0;
  uint32_t local_31cc;
  AssertionResult local_31c8;
  AssertHelper local_31b8;
  Message local_31b0;
  string local_31a8;
  AssertionResult local_3188;
  AssertHelper local_3178;
  Message local_3170;
  int64_t local_3168;
  int64_t local_3160;
  undefined1 local_3158;
  Amount local_3150;
  int64_t local_3140;
  AssertionResult local_3138;
  AssertHelper local_3128;
  Message local_3120 [4];
  AssertHelper local_3100;
  Message local_30f8;
  OutPoint local_30f0;
  AssertHelper local_30c8;
  Message local_30c0;
  SigHashType local_30b8;
  allocator local_30a9;
  string local_30a8;
  Privkey local_3088;
  allocator local_3061;
  string local_3060;
  Pubkey local_3040;
  OutPoint local_3028;
  AssertHelper local_3000;
  Message local_2ff8 [5];
  byte local_2fc9;
  ConstCharPtr local_2fc8;
  AssertHelper local_2fc0;
  Message local_2fb8;
  OutPoint local_2fb0;
  AssertHelper local_2f88;
  Message local_2f80;
  SigHashType local_2f78;
  allocator local_2f69;
  string local_2f68;
  Privkey local_2f48;
  allocator local_2f21;
  string local_2f20;
  Pubkey local_2f00;
  OutPoint local_2ee8;
  AssertHelper local_2ec0;
  Message local_2eb8 [5];
  byte local_2e89;
  ConstCharPtr local_2e88;
  AssertHelper local_2e80;
  Message local_2e78;
  OutPoint local_2e70;
  AssertHelper local_2e48;
  Message local_2e40;
  SigHashType local_2e38;
  allocator local_2e29;
  string local_2e28 [7];
  undefined1 in_stack_ffffffffffffd1df;
  SigHashType *in_stack_ffffffffffffd1e0;
  undefined8 in_stack_ffffffffffffd1e8;
  undefined8 in_stack_ffffffffffffd1f0;
  OutPoint *in_stack_ffffffffffffd1f8;
  TransactionContext *in_stack_ffffffffffffd200;
  ByteData256 *in_stack_ffffffffffffd210;
  ByteData *in_stack_ffffffffffffd218;
  string local_2de0;
  Pubkey local_2dc0;
  OutPoint local_2da8;
  ByteData local_2d80;
  AssertHelper local_2d68;
  Message local_2d60 [2];
  TransactionContext *in_stack_ffffffffffffd2b0;
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *in_stack_ffffffffffffd2c8;
  TransactionContext *in_stack_ffffffffffffd2d0;
  AssertHelper local_2c78;
  Message local_2c70;
  undefined4 local_2c64;
  int64_t local_2c60;
  AssertionResult local_2c58;
  string local_2c48;
  string local_2c28 [3];
  TransactionApi local_2bb1;
  Amount local_2bb0;
  Amount local_2ba0 [2];
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> local_2b78 [4];
  pointer local_2b10;
  ScriptElement *local_2b00;
  ScriptElement local_2af8 [7];
  OutPoint *in_stack_ffffffffffffd7e8;
  TransactionContext *in_stack_ffffffffffffd7f0;
  pointer in_stack_ffffffffffffd910;
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *in_stack_ffffffffffffd918;
  Amount *in_stack_ffffffffffffd920;
  pointer in_stack_ffffffffffffd928;
  pointer in_stack_ffffffffffffd930;
  pointer in_stack_ffffffffffffd938;
  string *in_stack_ffffffffffffd950;
  Amount *in_stack_ffffffffffffd958;
  UtxoFilter *in_stack_ffffffffffffd960;
  CoinSelectionOption *in_stack_ffffffffffffd968;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffd970;
  NetType_conflict in_stack_ffffffffffffd978;
  vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
  *in_stack_ffffffffffffd980;
  Amount *in_stack_ffffffffffffd988;
  ScriptElement local_2608 [13];
  ScriptElement local_2118 [13];
  undefined1 local_1c28 [80];
  undefined1 local_1bd8;
  size_type local_1bd0;
  undefined1 local_1bc8;
  Transaction local_1bc0 [2];
  Amount local_1b08;
  allocator local_1af1;
  string local_1af0;
  Address local_1ad0;
  allocator local_1951;
  string local_1950;
  Address local_1930;
  allocator local_17b1;
  string local_17b0;
  Address local_1790;
  Amount local_1618;
  allocator local_1601;
  string local_1600 [32];
  Address local_15e0;
  allocator local_1461;
  string local_1460;
  Script local_1440;
  allocator local_1401;
  string local_1400;
  Txid local_13e0;
  undefined8 local_13c0;
  Txid local_1398;
  uint32_t local_1378;
  Script local_1370 [2];
  Address local_1300;
  string local_1188 [32];
  Amount local_1168;
  undefined4 local_1158;
  undefined8 local_1150;
  Amount local_ed0;
  allocator local_eb9;
  string local_eb8 [32];
  Address local_e98;
  allocator local_d19;
  string local_d18;
  Script local_cf8;
  allocator local_cb9;
  string local_cb8;
  Txid local_c98;
  undefined8 local_c78;
  Txid local_c50;
  uint32_t local_c30;
  Script local_c28 [2];
  Address local_bb8;
  string local_a40 [32];
  int64_t local_a20;
  undefined1 local_a18;
  undefined4 local_a10;
  undefined8 local_a08;
  Amount local_788;
  allocator local_771;
  string local_770 [32];
  Address local_750;
  allocator local_5d1;
  string local_5d0;
  Script local_5b0;
  allocator local_571;
  string local_570;
  Txid local_550;
  undefined8 local_520;
  Txid local_4f8;
  uint32_t local_4d8;
  Script local_4d0 [2];
  Address local_460;
  string local_2e8 [32];
  Amount local_2c8;
  undefined4 local_2b8;
  undefined8 local_2b0;
  
  cfd::AddressFactory::AddressFactory
            ((AddressFactory *)in_stack_ffffffffffffcc20,
             (NetType)((ulong)in_stack_ffffffffffffcc18 >> 0x20));
  cfd::UtxoData::UtxoData((UtxoData *)CONCAT17(in_stack_ffffffffffffcc87,in_stack_ffffffffffffcc80))
  ;
  local_520 = 0;
  local_2b0 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_570,"4aa201f333e80b8f62ba5b593edb47b4730212e2917b21279f389ba1c14588a3"
             ,&local_571);
  cfd::core::Txid::Txid(&local_550,&local_570);
  cfd::core::Txid::operator=(&local_4f8,&local_550);
  cfd::core::Txid::~Txid((Txid *)0x2ebee6);
  std::__cxx11::string::~string((string *)&local_570);
  std::allocator<char>::~allocator((allocator<char> *)&local_571);
  local_4d8 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_5d0,"76a914f330ed8383f8afdc977dd88600eb8ff120ba15e488ac",&local_5d1);
  cfd::core::Script::Script(&local_5b0,&local_5d0);
  cfd::core::Script::operator=(local_4d0,&local_5b0);
  cfd::core::Script::~Script((Script *)in_stack_ffffffffffffcc20);
  std::__cxx11::string::~string((string *)&local_5d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_5d1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_770,"n3gq7EMkVLyrpSxVxKLFX8qsqiDC5DcqfW",&local_771);
  cfd::AddressFactory::GetAddress(in_stack_ffffffffffffcc28,(string *)in_stack_ffffffffffffcc20);
  cfd::core::Address::operator=(&local_460,&local_750);
  cfd::core::Address::~Address((Address *)in_stack_ffffffffffffcc20);
  std::__cxx11::string::~string(local_770);
  std::allocator<char>::~allocator((allocator<char> *)&local_771);
  std::__cxx11::string::operator=
            (local_2e8,"pkh(0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b)");
  cfd::core::Amount::Amount(&local_788,300000000000000);
  local_2c8.ignore_check_ = local_788.ignore_check_;
  local_2c8.amount_ = local_788.amount_;
  local_2b8 = 2;
  cfd::UtxoData::UtxoData((UtxoData *)CONCAT17(in_stack_ffffffffffffcc87,in_stack_ffffffffffffcc80))
  ;
  local_c78 = 0;
  local_a08 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_cb8,"31559192b619fd52b2cc0ca54d33778acae393ed31c453e29301a3919763b9e3"
             ,&local_cb9);
  cfd::core::Txid::Txid(&local_c98,&local_cb8);
  cfd::core::Txid::operator=(&local_c50,&local_c98);
  cfd::core::Txid::~Txid((Txid *)0x2ec110);
  std::__cxx11::string::~string((string *)&local_cb8);
  std::allocator<char>::~allocator((allocator<char> *)&local_cb9);
  local_c30 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_d18,"a9145d54db96a28f844a744e393fcd699d6f825b284187",&local_d19);
  cfd::core::Script::Script(&local_cf8,&local_d18);
  cfd::core::Script::operator=(local_c28,&local_cf8);
  cfd::core::Script::~Script((Script *)in_stack_ffffffffffffcc20);
  std::__cxx11::string::~string((string *)&local_d18);
  std::allocator<char>::~allocator((allocator<char> *)&local_d19);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_eb8,"2N1kiV9NkmZetZ3j7FuWGkBZxubBMPLxJ16",&local_eb9);
  cfd::AddressFactory::GetAddress(in_stack_ffffffffffffcc28,(string *)in_stack_ffffffffffffcc20);
  cfd::core::Address::operator=(&local_bb8,&local_e98);
  cfd::core::Address::~Address((Address *)in_stack_ffffffffffffcc20);
  std::__cxx11::string::~string(local_eb8);
  std::allocator<char>::~allocator((allocator<char> *)&local_eb9);
  std::__cxx11::string::operator=
            (local_a40,
             "sh(wpkh(0206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a27))");
  cfd::core::Amount::Amount(&local_ed0,400000000000000);
  local_a18 = local_ed0.ignore_check_;
  local_a20 = local_ed0.amount_;
  local_a10 = 6;
  cfd::UtxoData::UtxoData((UtxoData *)CONCAT17(in_stack_ffffffffffffcc87,in_stack_ffffffffffffcc80))
  ;
  local_13c0 = 0;
  local_1150 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_1400,
             "4aa201f333e80b8f62ba5b593edb47b4730212e2917b21279f389ba1c14588a3",&local_1401);
  cfd::core::Txid::Txid(&local_13e0,&local_1400);
  cfd::core::Txid::operator=(&local_1398,&local_13e0);
  cfd::core::Txid::~Txid((Txid *)0x2ec33a);
  std::__cxx11::string::~string((string *)&local_1400);
  std::allocator<char>::~allocator((allocator<char> *)&local_1401);
  local_1378 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_1460,"0014f330ed8383f8afdc977dd88600eb8ff120ba15e4",&local_1461);
  cfd::core::Script::Script(&local_1440,&local_1460);
  cfd::core::Script::operator=(local_1370,&local_1440);
  cfd::core::Script::~Script((Script *)in_stack_ffffffffffffcc20);
  std::__cxx11::string::~string((string *)&local_1460);
  std::allocator<char>::~allocator((allocator<char> *)&local_1461);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_1600,"bcrt1q7vcwmqurlzhae9mamzrqp6u07yst590y5ujv3w",&local_1601);
  cfd::AddressFactory::GetAddress(in_stack_ffffffffffffcc28,(string *)in_stack_ffffffffffffcc20);
  cfd::core::Address::operator=(&local_1300,&local_15e0);
  cfd::core::Address::~Address((Address *)in_stack_ffffffffffffcc20);
  std::__cxx11::string::~string(local_1600);
  std::allocator<char>::~allocator((allocator<char> *)&local_1601);
  std::__cxx11::string::operator=
            (local_1188,"wpkh(0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b)");
  cfd::core::Amount::Amount(&local_1618,300000000000000);
  local_1168.ignore_check_ = local_1618.ignore_check_;
  local_1168.amount_ = local_1618.amount_;
  local_1158 = 4;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_17b0,"mtmTFSnUTqGt6AaSqoRemj7ePPZ6YGXWeo",&local_17b1);
  cfd::core::Address::Address(&local_1790,&local_17b0);
  std::__cxx11::string::~string((string *)&local_17b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_17b1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_1950,"bcrt1qg4nrukf07cf4slc0m4h8gq6v2guhzrw29sfnlu",&local_1951);
  cfd::core::Address::Address(&local_1930,&local_1950);
  std::__cxx11::string::~string((string *)&local_1950);
  std::allocator<char>::~allocator((allocator<char> *)&local_1951);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_1af0,"bcrt1q7vcwmqurlzhae9mamzrqp6u07yst590y5ujv3w",&local_1af1);
  cfd::core::Address::Address(&local_1ad0,&local_1af0);
  std::__cxx11::string::~string((string *)&local_1af0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1af1);
  cfd::core::Amount::Amount(&local_1b08,10000);
  cfd::TransactionContext::TransactionContext
            ((TransactionContext *)in_stack_ffffffffffffcc20,
             (uint32_t)((ulong)in_stack_ffffffffffffcc18 >> 0x20),
             (uint32_t)in_stack_ffffffffffffcc18);
  AVar4 = cfd::core::operator+(&local_2c8,&local_1168);
  local_1c28._56_8_ = AVar4.amount_;
  local_1c28[0x40] = AVar4.ignore_check_;
  local_1c28._72_8_ = local_1c28._56_8_;
  local_1bd8 = local_1c28[0x40];
  AVar4 = cfd::core::operator-((Amount *)(local_1c28 + 0x48),&local_1b08);
  local_1c28._40_8_ = AVar4.amount_;
  local_1c28[0x30] = AVar4.ignore_check_;
  local_1bd0 = local_1c28._40_8_;
  local_1bc8 = local_1c28[0x30];
  cfd::TransactionContext::AddTxOut
            (in_stack_ffffffffffffcca0,in_stack_ffffffffffffcc98,
             (Amount *)CONCAT17(in_stack_ffffffffffffcc97,in_stack_ffffffffffffcc90));
  cfd::TransactionContext::AddTxOut
            (in_stack_ffffffffffffcca0,in_stack_ffffffffffffcc98,
             (Amount *)CONCAT17(in_stack_ffffffffffffcc97,in_stack_ffffffffffffcc90));
  local_2b00 = local_2af8;
  cfd::UtxoData::UtxoData
            ((UtxoData *)CONCAT17(in_stack_ffffffffffffcc97,in_stack_ffffffffffffcc90),
             in_stack_ffffffffffffcc88);
  local_2b00 = local_2608;
  cfd::UtxoData::UtxoData
            ((UtxoData *)CONCAT17(in_stack_ffffffffffffcc97,in_stack_ffffffffffffcc90),
             in_stack_ffffffffffffcc88);
  local_2b00 = local_2118;
  cfd::UtxoData::UtxoData
            ((UtxoData *)CONCAT17(in_stack_ffffffffffffcc97,in_stack_ffffffffffffcc90),
             in_stack_ffffffffffffcc88);
  local_1c28._0_8_ = local_2af8;
  local_1c28._8_8_ = 3;
  std::allocator<cfd::UtxoData>::allocator((allocator<cfd::UtxoData> *)0x2ec7b5);
  __l._M_len._0_4_ = in_stack_ffffffffffffcc60;
  __l._M_array = (iterator)in_stack_ffffffffffffcc58;
  __l._M_len._4_4_ = in_stack_ffffffffffffcc64;
  std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::vector
            (in_stack_ffffffffffffcc50,__l,in_stack_ffffffffffffcc48);
  std::allocator<cfd::UtxoData>::~allocator((allocator<cfd::UtxoData> *)0x2ec7e9);
  local_32a0 = (ScriptElement *)local_1c28;
  do {
    local_32a0 = (ScriptElement *)
                 &local_32a0[-0xe].binary_data_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage;
    cfd::UtxoData::~UtxoData(in_stack_ffffffffffffcc20);
  } while (local_32a0 != local_2af8);
  local_2b10 = (pointer)0x4034000000000000;
  cfd::CoinSelectionOption::CoinSelectionOption((CoinSelectionOption *)in_stack_ffffffffffffcc20);
  std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::vector
            ((vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *)0x2ec86e);
  cfd::core::Amount::Amount(local_2ba0);
  cfd::core::Amount::Amount(&local_2bb0);
  cfd::api::TransactionApi::TransactionApi(&local_2bb1);
  cfd::core::AbstractTransaction::GetHex_abi_cxx11_
            (local_2c28,&local_1bc0[0].super_AbstractTransaction);
  cfd::core::Address::GetAddress_abi_cxx11_(&local_2c48,&local_1ad0);
  this_02 = local_2b78;
  this_00 = (UtxoData *)&local_2bb0;
  tx_hex = &local_2c48;
  pcVar5 = (char *)0x0;
  this_01 = (TransactionContext *)0x0;
  cfd::api::TransactionApi::FundRawTransaction
            ((TransactionApi *)in_stack_ffffffffffffd938,(string *)in_stack_ffffffffffffd930,
             (vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *)in_stack_ffffffffffffd928,
             in_stack_ffffffffffffd920,in_stack_ffffffffffffd918,in_stack_ffffffffffffd950,
             (double)in_stack_ffffffffffffd910,in_stack_ffffffffffffd958,in_stack_ffffffffffffd960,
             in_stack_ffffffffffffd968,in_stack_ffffffffffffd970,in_stack_ffffffffffffd978,
             in_stack_ffffffffffffd980,in_stack_ffffffffffffd988);
  std::__cxx11::string::~string((string *)&local_2c48);
  std::__cxx11::string::~string((string *)local_2c28);
  local_2c60 = cfd::core::Amount::GetSatoshiValue(&local_2bb0);
  local_2c64 = 0x20a8;
  testing::internal::EqHelper<false>::Compare<long,int>
            (pcVar5,(char *)this_02,(long *)this_01,(int *)this_00);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_2c58);
  if (!bVar1) {
    testing::Message::Message(&local_2c70);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x2ed0f4);
    testing::internal::AssertHelper::AssertHelper
              (&local_2c78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfdapi_transaction.cpp"
               ,0xf7,pcVar3);
    testing::internal::AssertHelper::operator=(&local_2c78,&local_2c70);
    testing::internal::AssertHelper::~AssertHelper(&local_2c78);
    testing::Message::~Message((Message *)0x2ed157);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x2ed1af);
  cfd::AbstractTransactionController::GetHex_abi_cxx11_((AbstractTransactionController *)tx_hex);
  cfd::TransactionContext::TransactionContext((TransactionContext *)this_00,tx_hex);
  cfd::TransactionContext::operator=
            ((TransactionContext *)CONCAT44(in_stack_ffffffffffffcc64,in_stack_ffffffffffffcc60),
             in_stack_ffffffffffffcc58);
  cfd::TransactionContext::~TransactionContext((TransactionContext *)this_00);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffd2b0);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::TransactionContext::CollectInputUtxo(in_stack_ffffffffffffd2d0,in_stack_ffffffffffffd2c8)
      ;
    }
  }
  else {
    testing::Message::Message(local_2d60);
    testing::internal::AssertHelper::AssertHelper
              (&local_2d68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfdapi_transaction.cpp"
               ,0xfa,
               "Expected: txc.CollectInputUtxo(utxos) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_2d68,local_2d60);
    testing::internal::AssertHelper::~AssertHelper(&local_2d68);
    testing::Message::~Message((Message *)0x2ed366);
  }
  cfd::core::ByteData::ByteData(&local_2d80);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::OutPoint::OutPoint(&local_2da8,&local_4f8,local_4d8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_2de0,
                 "0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b",
                 (allocator *)&stack0xffffffffffffd21f);
      cfd::core::Pubkey::Pubkey(&local_2dc0,&local_2de0);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_2e28,"cQSo3DLRNg4G57hRkbo2d2pY3QSuRM9eact7LroG46XyZbZByxi5",&local_2e29);
      cfd::core::Privkey::FromWif
                ((Privkey *)&stack0xffffffffffffd1f8,(string *)local_2e28,kTestnet,true);
      cfd::core::SigHashType::SigHashType(&local_2e38);
      this_00 = (UtxoData *)0x0;
      tx_hex = (string *)0x0;
      cfd::TransactionContext::SignWithKey
                (in_stack_ffffffffffffd200,in_stack_ffffffffffffd1f8,
                 (Pubkey *)in_stack_ffffffffffffd1f0,(Privkey *)in_stack_ffffffffffffd1e8,
                 in_stack_ffffffffffffd1e0,(bool)in_stack_ffffffffffffd1df,in_stack_ffffffffffffd210
                 ,in_stack_ffffffffffffd218);
      cfd::core::Privkey::~Privkey((Privkey *)0x2ed518);
      std::__cxx11::string::~string(local_2e28);
      std::allocator<char>::~allocator((allocator<char> *)&local_2e29);
      cfd::core::Pubkey::~Pubkey((Pubkey *)0x2ed53f);
      std::__cxx11::string::~string((string *)&local_2de0);
      std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffd21f);
      cfd::core::OutPoint::~OutPoint((OutPoint *)0x2ed566);
    }
  }
  else {
    testing::Message::Message(&local_2e40);
    testing::internal::AssertHelper::AssertHelper
              (&local_2e48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfdapi_transaction.cpp"
               ,0x101,
               "Expected: txc.SignWithKey(OutPoint(utxo1.txid, utxo1.vout), Pubkey(\"0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b\"), Privkey::FromWif( \"cQSo3DLRNg4G57hRkbo2d2pY3QSuRM9eact7LroG46XyZbZByxi5\", NetType::kTestnet)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_2e48,&local_2e40);
    testing::internal::AssertHelper::~AssertHelper(&local_2e48);
    testing::Message::~Message((Message *)0x2ed6f8);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::OutPoint::OutPoint(&local_2e70,&local_4f8,local_4d8);
      cfd::TransactionContext::Verify(in_stack_ffffffffffffd7f0,in_stack_ffffffffffffd7e8);
      cfd::core::OutPoint::~OutPoint((OutPoint *)0x2ed7c1);
    }
  }
  else {
    testing::Message::Message(&local_2e78);
    testing::internal::AssertHelper::AssertHelper
              (&local_2e80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfdapi_transaction.cpp"
               ,0x102,
               "Expected: txc.Verify(OutPoint(utxo1.txid, utxo1.vout)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_2e80,&local_2e78);
    testing::internal::AssertHelper::~AssertHelper(&local_2e80);
    testing::Message::~Message((Message *)0x2ed88b);
  }
  testing::internal::ConstCharPtr::ConstCharPtr(&local_2e88,"");
  bVar1 = testing::internal::ConstCharPtr::operator_cast_to_bool(&local_2e88);
  if (bVar1) {
    local_2e89 = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::TransactionContext::Finalize(this_01);
      cfd::core::ByteData::operator=((ByteData *)this_00,(ByteData *)tx_hex);
      cfd::core::ByteData::~ByteData((ByteData *)0x2ed971);
    }
    if ((local_2e89 & 1) == 0) {
      local_2e88.value =
           "Expected: (tx = txc.Finalize()) throws an exception of type CfdException.\n  Actual: it throws nothing."
      ;
      goto LAB_002eda14;
    }
  }
  else {
LAB_002eda14:
    testing::Message::Message(local_2eb8);
    testing::internal::AssertHelper::AssertHelper
              (&local_2ec0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfdapi_transaction.cpp"
               ,0x103,local_2e88.value);
    testing::internal::AssertHelper::operator=(&local_2ec0,local_2eb8);
    testing::internal::AssertHelper::~AssertHelper(&local_2ec0);
    testing::Message::~Message((Message *)0x2eda7c);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::OutPoint::OutPoint(&local_2ee8,&local_c50,local_c30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_2f20,
                 "0206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a27",&local_2f21);
      cfd::core::Pubkey::Pubkey(&local_2f00,&local_2f20);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_2f68,"cVtoSAzA814NCpEjz1Gumv2c5jCQ1f8Axcd58NDeds8Wxrn9dMVP",
                 &local_2f69);
      cfd::core::Privkey::FromWif(&local_2f48,&local_2f68,kTestnet,true);
      cfd::core::SigHashType::SigHashType(&local_2f78);
      this_00 = (UtxoData *)0x0;
      tx_hex = (string *)0x0;
      cfd::TransactionContext::SignWithKey
                (in_stack_ffffffffffffd200,in_stack_ffffffffffffd1f8,
                 (Pubkey *)in_stack_ffffffffffffd1f0,(Privkey *)in_stack_ffffffffffffd1e8,
                 in_stack_ffffffffffffd1e0,(bool)in_stack_ffffffffffffd1df,in_stack_ffffffffffffd210
                 ,in_stack_ffffffffffffd218);
      cfd::core::Privkey::~Privkey((Privkey *)0x2edc1f);
      std::__cxx11::string::~string((string *)&local_2f68);
      std::allocator<char>::~allocator((allocator<char> *)&local_2f69);
      cfd::core::Pubkey::~Pubkey((Pubkey *)0x2edc46);
      std::__cxx11::string::~string((string *)&local_2f20);
      std::allocator<char>::~allocator((allocator<char> *)&local_2f21);
      cfd::core::OutPoint::~OutPoint((OutPoint *)0x2edc6d);
    }
  }
  else {
    testing::Message::Message(&local_2f80);
    testing::internal::AssertHelper::AssertHelper
              (&local_2f88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfdapi_transaction.cpp"
               ,0x108,
               "Expected: txc.SignWithKey(OutPoint(utxo2.txid, utxo2.vout), Pubkey(\"0206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a27\"), Privkey::FromWif( \"cVtoSAzA814NCpEjz1Gumv2c5jCQ1f8Axcd58NDeds8Wxrn9dMVP\", NetType::kTestnet)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_2f88,&local_2f80);
    testing::internal::AssertHelper::~AssertHelper(&local_2f88);
    testing::Message::~Message((Message *)0x2edde6);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::OutPoint::OutPoint(&local_2fb0,&local_c50,local_c30);
      cfd::TransactionContext::Verify(in_stack_ffffffffffffd7f0,in_stack_ffffffffffffd7e8);
      cfd::core::OutPoint::~OutPoint((OutPoint *)0x2edeaf);
    }
  }
  else {
    testing::Message::Message(&local_2fb8);
    testing::internal::AssertHelper::AssertHelper
              (&local_2fc0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfdapi_transaction.cpp"
               ,0x109,
               "Expected: txc.Verify(OutPoint(utxo2.txid, utxo2.vout)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_2fc0,&local_2fb8);
    testing::internal::AssertHelper::~AssertHelper(&local_2fc0);
    testing::Message::~Message((Message *)0x2edf79);
  }
  testing::internal::ConstCharPtr::ConstCharPtr(&local_2fc8,"");
  bVar1 = testing::internal::ConstCharPtr::operator_cast_to_bool(&local_2fc8);
  if (bVar1) {
    local_2fc9 = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::TransactionContext::Finalize(this_01);
      cfd::core::ByteData::operator=((ByteData *)this_00,(ByteData *)tx_hex);
      cfd::core::ByteData::~ByteData((ByteData *)0x2ee05f);
    }
    if ((local_2fc9 & 1) != 0) goto LAB_002ee1b5;
    local_2fc8.value =
         "Expected: (tx = txc.Finalize()) throws an exception of type CfdException.\n  Actual: it throws nothing."
    ;
  }
  testing::Message::Message(local_2ff8);
  testing::internal::AssertHelper::AssertHelper
            (&local_3000,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfdapi_transaction.cpp"
             ,0x10a,local_2fc8.value);
  testing::internal::AssertHelper::operator=(&local_3000,local_2ff8);
  testing::internal::AssertHelper::~AssertHelper(&local_3000);
  testing::Message::~Message((Message *)0x2ee16a);
LAB_002ee1b5:
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::OutPoint::OutPoint(&local_3028,&local_1398,local_1378);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_3060,
                 "0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b",&local_3061);
      cfd::core::Pubkey::Pubkey(&local_3040,&local_3060);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_30a8,"cQSo3DLRNg4G57hRkbo2d2pY3QSuRM9eact7LroG46XyZbZByxi5",
                 &local_30a9);
      cfd::core::Privkey::FromWif(&local_3088,&local_30a8,kTestnet,true);
      cfd::core::SigHashType::SigHashType(&local_30b8);
      this_00 = (UtxoData *)0x0;
      tx_hex = (string *)0x0;
      cfd::TransactionContext::SignWithKey
                (in_stack_ffffffffffffd200,in_stack_ffffffffffffd1f8,
                 (Pubkey *)in_stack_ffffffffffffd1f0,(Privkey *)in_stack_ffffffffffffd1e8,
                 in_stack_ffffffffffffd1e0,(bool)in_stack_ffffffffffffd1df,in_stack_ffffffffffffd210
                 ,in_stack_ffffffffffffd218);
      cfd::core::Privkey::~Privkey((Privkey *)0x2ee30d);
      std::__cxx11::string::~string((string *)&local_30a8);
      std::allocator<char>::~allocator((allocator<char> *)&local_30a9);
      cfd::core::Pubkey::~Pubkey((Pubkey *)0x2ee334);
      std::__cxx11::string::~string((string *)&local_3060);
      std::allocator<char>::~allocator((allocator<char> *)&local_3061);
      cfd::core::OutPoint::~OutPoint((OutPoint *)0x2ee35b);
    }
  }
  else {
    testing::Message::Message(&local_30c0);
    testing::internal::AssertHelper::AssertHelper
              (&local_30c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfdapi_transaction.cpp"
               ,0x10f,
               "Expected: txc.SignWithKey(OutPoint(utxo3.txid, utxo3.vout), Pubkey(\"0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b\"), Privkey::FromWif( \"cQSo3DLRNg4G57hRkbo2d2pY3QSuRM9eact7LroG46XyZbZByxi5\", NetType::kTestnet)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_30c8,&local_30c0);
    testing::internal::AssertHelper::~AssertHelper(&local_30c8);
    testing::Message::~Message((Message *)0x2ee4d4);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::OutPoint::OutPoint(&local_30f0,&local_1398,local_1378);
      cfd::TransactionContext::Verify(in_stack_ffffffffffffd7f0,in_stack_ffffffffffffd7e8);
      cfd::core::OutPoint::~OutPoint((OutPoint *)0x2ee59d);
    }
  }
  else {
    testing::Message::Message(&local_30f8);
    testing::internal::AssertHelper::AssertHelper
              (&local_3100,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfdapi_transaction.cpp"
               ,0x110,
               "Expected: txc.Verify(OutPoint(utxo3.txid, utxo3.vout)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_3100,&local_30f8);
    testing::internal::AssertHelper::~AssertHelper(&local_3100);
    testing::Message::~Message((Message *)0x2ee667);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::TransactionContext::Finalize(this_01);
      cfd::core::ByteData::operator=((ByteData *)this_00,(ByteData *)tx_hex);
      cfd::core::ByteData::~ByteData((ByteData *)0x2ee724);
    }
  }
  else {
    testing::Message::Message(local_3120);
    testing::internal::AssertHelper::AssertHelper
              (&local_3128,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfdapi_transaction.cpp"
               ,0x112,
               "Expected: tx = txc.Finalize() doesn\'t throw an exception.\n  Actual: it throws.");
    testing::internal::AssertHelper::operator=(&local_3128,local_3120);
    testing::internal::AssertHelper::~AssertHelper(&local_3128);
    testing::Message::~Message((Message *)0x2ee7cb);
  }
  AVar4 = cfd::TransactionContext::GetFeeAmount(in_stack_ffffffffffffd2b0);
  local_3160 = AVar4.amount_;
  local_3158 = AVar4.ignore_check_;
  local_3150.amount_ = local_3160;
  local_3150.ignore_check_ = (bool)local_3158;
  local_3140 = cfd::core::Amount::GetSatoshiValue(&local_3150);
  local_3168 = cfd::core::Amount::GetSatoshiValue(&local_2bb0);
  testing::internal::EqHelper<false>::Compare<long,long>
            (pcVar5,(char *)this_02,(long *)this_01,(long *)this_00);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_3138);
  if (!bVar1) {
    testing::Message::Message(&local_3170);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x2ee942);
    testing::internal::AssertHelper::AssertHelper
              (&local_3178,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfdapi_transaction.cpp"
               ,0x113,pcVar3);
    testing::internal::AssertHelper::operator=(&local_3178,&local_3170);
    testing::internal::AssertHelper::~AssertHelper(&local_3178);
    testing::Message::~Message((Message *)0x2ee99f);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x2ee9f7);
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_31a8,&local_2d80);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_3188,"tx.GetHex().c_str()",
             "\"02000000000103e3b9639791a30193e253c431ed93e3ca8a77334da50cccb252fd19b692915531000000001716001445663e592ff613587f0fdd6e74034c5239710dcaffffffffa38845c1a19b389f27217b91e2120273b447db3e595bba628f0be833f301a24a0100000000ffffffffa38845c1a19b389f27217b91e2120273b447db3e595bba628f0be833f301a24a000000006a4730440220644d3014684db32df93e6e342e2d0872aa6272d3a9cdce021138592ef78fc2a8022054a2a85c6339dee9578d9989920100f0660bd45b9cf7b14444f012bf5ee0bd7601210359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567bffffffff03f058dd62b22102001976a9149157a10c10924d7550ee7079cda55db1d11a278a88ac0000e941cc6b010016001445663e592ff613587f0fdd6e74034c5239710dca6806000000000000160014f330ed8383f8afdc977dd88600eb8ff120ba15e40247304402202ece1dae47832c07863b5052133c9af652e9521e0fbaf4ef7558ca45ec739ca902205ad29147c0f5f16277a7a00391f8b5d43b9b6c149721cdb4591ba18c701dbd5f01210206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a2702473044022058e88c67379c5b5c49dfef09eb069833ba9ae7cd6f8a5f9bdcf657ed8ad91b820220039739df97dc8488a93f61000cbade6d48df737238519660a02071795aabd74801210359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b0000000000\""
             ,pcVar3,
             "02000000000103e3b9639791a30193e253c431ed93e3ca8a77334da50cccb252fd19b692915531000000001716001445663e592ff613587f0fdd6e74034c5239710dcaffffffffa38845c1a19b389f27217b91e2120273b447db3e595bba628f0be833f301a24a0100000000ffffffffa38845c1a19b389f27217b91e2120273b447db3e595bba628f0be833f301a24a000000006a4730440220644d3014684db32df93e6e342e2d0872aa6272d3a9cdce021138592ef78fc2a8022054a2a85c6339dee9578d9989920100f0660bd45b9cf7b14444f012bf5ee0bd7601210359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567bffffffff03f058dd62b22102001976a9149157a10c10924d7550ee7079cda55db1d11a278a88ac0000e941cc6b010016001445663e592ff613587f0fdd6e74034c5239710dca6806000000000000160014f330ed8383f8afdc977dd88600eb8ff120ba15e40247304402202ece1dae47832c07863b5052133c9af652e9521e0fbaf4ef7558ca45ec739ca902205ad29147c0f5f16277a7a00391f8b5d43b9b6c149721cdb4591ba18c701dbd5f01210206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a2702473044022058e88c67379c5b5c49dfef09eb069833ba9ae7cd6f8a5f9bdcf657ed8ad91b820220039739df97dc8488a93f61000cbade6d48df737238519660a02071795aabd74801210359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b0000000000"
            );
  std::__cxx11::string::~string((string *)&local_31a8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_3188);
  if (!bVar1) {
    testing::Message::Message(&local_31b0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x2eeade);
    testing::internal::AssertHelper::AssertHelper
              (&local_31b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfdapi_transaction.cpp"
               ,0x114,pcVar3);
    testing::internal::AssertHelper::operator=(&local_31b8,&local_31b0);
    testing::internal::AssertHelper::~AssertHelper(&local_31b8);
    testing::Message::~Message((Message *)0x2eeb3b);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x2eeb93);
  local_31cc = cfd::core::Transaction::GetVsize(local_1bc0);
  local_31d0 = 0x19d;
  testing::internal::EqHelper<false>::Compare<unsigned_int,int>
            (pcVar5,(char *)this_02,(uint *)this_01,(int *)this_00);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_31c8);
  if (!bVar1) {
    testing::Message::Message(&local_31d8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x2eec52);
    testing::internal::AssertHelper::AssertHelper
              (&local_31e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfdapi_transaction.cpp"
               ,0x115,pcVar3);
    testing::internal::AssertHelper::operator=(&local_31e0,&local_31d8);
    testing::internal::AssertHelper::~AssertHelper(&local_31e0);
    testing::Message::~Message((Message *)0x2eecaf);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x2eed07);
  uVar2 = cfd::core::Transaction::GetVsize(local_1bc0);
  local_31e4 = uVar2 * (int)(long)(double)local_2b10;
  local_31fc = 0x2044;
  testing::internal::EqHelper<false>::Compare<unsigned_int,int>
            (pcVar5,(char *)this_02,(uint *)this_01,(int *)this_00);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_31f8);
  if (!bVar1) {
    testing::Message::Message(&local_3208);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x2eedd3);
    testing::internal::AssertHelper::AssertHelper
              (&local_3210,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfdapi_transaction.cpp"
               ,0x118,pcVar5);
    testing::internal::AssertHelper::operator=(&local_3210,&local_3208);
    testing::internal::AssertHelper::~AssertHelper(&local_3210);
    testing::Message::~Message((Message *)0x2eee30);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x2eee88);
  cfd::core::ByteData::~ByteData((ByteData *)0x2eee95);
  cfd::TransactionController::~TransactionController((TransactionController *)this_00);
  std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::~vector(this_02);
  cfd::CoinSelectionOption::~CoinSelectionOption((CoinSelectionOption *)0x2eeebc);
  std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::~vector(this_02);
  cfd::TransactionContext::~TransactionContext((TransactionContext *)this_00);
  cfd::core::Address::~Address((Address *)this_00);
  cfd::core::Address::~Address((Address *)this_00);
  cfd::core::Address::~Address((Address *)this_00);
  cfd::UtxoData::~UtxoData(this_00);
  cfd::UtxoData::~UtxoData(this_00);
  cfd::UtxoData::~UtxoData(this_00);
  cfd::AddressFactory::~AddressFactory((AddressFactory *)0x2eef31);
  return;
}

Assistant:

TEST(TransactionApi, FundRawTransaction_MillionAmountValue) {
  AddressFactory factory(NetType::kRegtest);
  // Address1
  // pubkey: '0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b',
  // privkey: 'cQSo3DLRNg4G57hRkbo2d2pY3QSuRM9eact7LroG46XyZbZByxi5'
  UtxoData utxo1;
  utxo1.block_height = 0;
  utxo1.binary_data = nullptr;
  utxo1.txid = Txid("4aa201f333e80b8f62ba5b593edb47b4730212e2917b21279f389ba1c14588a3");
  utxo1.vout = 0;
  utxo1.locking_script = Script("76a914f330ed8383f8afdc977dd88600eb8ff120ba15e488ac");
  // utxo1.redeem_script = Script("");
  utxo1.address = factory.GetAddress("n3gq7EMkVLyrpSxVxKLFX8qsqiDC5DcqfW");
  utxo1.descriptor = "pkh(0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b)";
  utxo1.amount = Amount(int64_t{300000000000000});
  utxo1.address_type = AddressType::kP2pkhAddress;

  // Address2 (pattern-x1)
  // pubkey: '0206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a27',
  // privkey: 'cVtoSAzA814NCpEjz1Gumv2c5jCQ1f8Axcd58NDeds8Wxrn9dMVP'
  UtxoData utxo2;
  utxo2.block_height = 0;
  utxo2.binary_data = nullptr;
  utxo2.txid = Txid("31559192b619fd52b2cc0ca54d33778acae393ed31c453e29301a3919763b9e3");
  utxo2.vout = 0;
  utxo2.locking_script = Script("a9145d54db96a28f844a744e393fcd699d6f825b284187");
  // utxo1.redeem_script = Script("");
  utxo2.address = factory.GetAddress("2N1kiV9NkmZetZ3j7FuWGkBZxubBMPLxJ16");
  utxo2.descriptor = "sh(wpkh(0206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a27))";
  utxo2.amount = Amount(int64_t{400000000000000});
  utxo2.address_type = AddressType::kP2shP2wpkhAddress;

  // Address3
  // pubkey: '0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b',
  // privkey: 'cQSo3DLRNg4G57hRkbo2d2pY3QSuRM9eact7LroG46XyZbZByxi5'
  UtxoData utxo3;
  utxo3.block_height = 0;
  utxo3.binary_data = nullptr;
  utxo3.txid = Txid("4aa201f333e80b8f62ba5b593edb47b4730212e2917b21279f389ba1c14588a3");
  utxo3.vout = 1;
  utxo3.locking_script = Script("0014f330ed8383f8afdc977dd88600eb8ff120ba15e4");
  // utxo1.redeem_script = Script("");
  utxo3.address = factory.GetAddress("bcrt1q7vcwmqurlzhae9mamzrqp6u07yst590y5ujv3w");
  utxo3.descriptor = "wpkh(0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b)";
  utxo3.amount = Amount(int64_t{300000000000000});
  utxo3.address_type = AddressType::kP2wpkhAddress;

  // "2dngFLukCWCjXVusBspjAuGsCRwW4eyAtg6";
  Address address("mtmTFSnUTqGt6AaSqoRemj7ePPZ6YGXWeo");
  // "0206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a27"
  Address address2("bcrt1qg4nrukf07cf4slc0m4h8gq6v2guhzrw29sfnlu");
  Address address3("bcrt1q7vcwmqurlzhae9mamzrqp6u07yst590y5ujv3w");

  Amount fee(int64_t{10000});
  TransactionContext txc(2, 0);
  txc.AddTxOut(address, utxo1.amount + utxo3.amount - fee);
  txc.AddTxOut(address2, utxo2.amount);

  std::vector<cfd::UtxoData> utxos{utxo1, utxo2, utxo3};

  double effective_fee_rate = 20.0;
  CoinSelectionOption option;
  std::vector<UtxoData> selected_txin_utxos;
  Amount target_value;
  Amount estimate_fee;


  TransactionApi api;
  auto tx_obj = api.FundRawTransaction(
      txc.GetHex(), utxos, target_value, selected_txin_utxos, address3.GetAddress(),
      effective_fee_rate, &estimate_fee, nullptr, &option, nullptr, NetType::kRegtest);
  EXPECT_EQ(estimate_fee.GetSatoshiValue(), 8360);

  txc = TransactionContext(tx_obj.GetHex());
  EXPECT_NO_THROW(txc.CollectInputUtxo(utxos));

  ByteData tx;

  EXPECT_NO_THROW(txc.SignWithKey(OutPoint(utxo1.txid, utxo1.vout),
      Pubkey("0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b"),
      Privkey::FromWif(
          "cQSo3DLRNg4G57hRkbo2d2pY3QSuRM9eact7LroG46XyZbZByxi5", NetType::kTestnet)));
  EXPECT_NO_THROW(txc.Verify(OutPoint(utxo1.txid, utxo1.vout)));
  EXPECT_THROW((tx = txc.Finalize()), CfdException);

  EXPECT_NO_THROW(txc.SignWithKey(OutPoint(utxo2.txid, utxo2.vout),
      Pubkey("0206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a27"),
      Privkey::FromWif(
          "cVtoSAzA814NCpEjz1Gumv2c5jCQ1f8Axcd58NDeds8Wxrn9dMVP", NetType::kTestnet)));
  EXPECT_NO_THROW(txc.Verify(OutPoint(utxo2.txid, utxo2.vout)));
  EXPECT_THROW((tx = txc.Finalize()), CfdException);

  EXPECT_NO_THROW(txc.SignWithKey(OutPoint(utxo3.txid, utxo3.vout),
      Pubkey("0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b"),
      Privkey::FromWif(
          "cQSo3DLRNg4G57hRkbo2d2pY3QSuRM9eact7LroG46XyZbZByxi5", NetType::kTestnet)));
  EXPECT_NO_THROW(txc.Verify(OutPoint(utxo3.txid, utxo3.vout)));

  EXPECT_NO_THROW(tx = txc.Finalize());
  EXPECT_EQ(txc.GetFeeAmount().GetSatoshiValue(), estimate_fee.GetSatoshiValue());
  EXPECT_STREQ(tx.GetHex().c_str(), "02000000000103e3b9639791a30193e253c431ed93e3ca8a77334da50cccb252fd19b692915531000000001716001445663e592ff613587f0fdd6e74034c5239710dcaffffffffa38845c1a19b389f27217b91e2120273b447db3e595bba628f0be833f301a24a0100000000ffffffffa38845c1a19b389f27217b91e2120273b447db3e595bba628f0be833f301a24a000000006a4730440220644d3014684db32df93e6e342e2d0872aa6272d3a9cdce021138592ef78fc2a8022054a2a85c6339dee9578d9989920100f0660bd45b9cf7b14444f012bf5ee0bd7601210359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567bffffffff03f058dd62b22102001976a9149157a10c10924d7550ee7079cda55db1d11a278a88ac0000e941cc6b010016001445663e592ff613587f0fdd6e74034c5239710dca6806000000000000160014f330ed8383f8afdc977dd88600eb8ff120ba15e40247304402202ece1dae47832c07863b5052133c9af652e9521e0fbaf4ef7558ca45ec739ca902205ad29147c0f5f16277a7a00391f8b5d43b9b6c149721cdb4591ba18c701dbd5f01210206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a2702473044022058e88c67379c5b5c49dfef09eb069833ba9ae7cd6f8a5f9bdcf657ed8ad91b820220039739df97dc8488a93f61000cbade6d48df737238519660a02071795aabd74801210359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b0000000000");
  EXPECT_EQ(txc.GetVsize(), 413);

  uint32_t minimum_fee = txc.GetVsize() * static_cast<uint32_t>(effective_fee_rate);
  EXPECT_EQ(minimum_fee, 8260);
}